

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bn_shift.c
# Opt level: O3

int BN_rshift1(BIGNUM *r,BIGNUM *a)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong uVar3;
  int iVar4;
  BIGNUM *pBVar5;
  ulong uVar6;
  ulong uVar7;
  int words;
  long lVar8;
  
  iVar4 = BN_is_zero((BIGNUM *)a);
  if (iVar4 == 0) {
    iVar4 = a->top;
    lVar8 = (long)iVar4;
    puVar1 = a->d;
    words = iVar4 - (uint)(puVar1[lVar8 + -1] == 1);
    if (a != r) {
      pBVar5 = bn_wexpand((BIGNUM *)r,words);
      if (pBVar5 == (BIGNUM *)0x0) {
        return 0;
      }
      r->neg = a->neg;
    }
    puVar2 = r->d;
    uVar6 = puVar1[lVar8 + -1];
    if (1 < uVar6) {
      puVar2[lVar8 + -1] = uVar6 >> 1;
    }
    if (1 < iVar4) {
      uVar7 = (lVar8 - 1U & 0xffffffff) + 1;
      do {
        uVar3 = puVar1[uVar7 - 2];
        puVar2[uVar7 - 2] = uVar6 << 0x3f | uVar3 >> 1;
        uVar7 = uVar7 - 1;
        uVar6 = uVar3;
      } while (1 < uVar7);
    }
    r->top = words;
  }
  else {
    BN_zero_ex((BIGNUM *)r);
  }
  return 1;
}

Assistant:

int BN_rshift1(BIGNUM *r, const BIGNUM *a)
{
    BN_ULONG *ap, *rp, t, c;
    int i, j;

    bn_check_top(r);
    bn_check_top(a);

    if (BN_is_zero(a)) {
        BN_zero(r);
        return (1);
    }
    i = a->top;
    ap = a->d;
    j = i - (ap[i - 1] == 1);
    if (a != r) {
        if (bn_wexpand(r, j) == NULL)
            return (0);
        r->neg = a->neg;
    }
    rp = r->d;
    t = ap[--i];
    c = (t & 1) ? BN_TBIT : 0;
    if (t >>= 1)
        rp[i] = t;
    while (i > 0) {
        t = ap[--i];
        rp[i] = ((t >> 1) & BN_MASK2) | c;
        c = (t & 1) ? BN_TBIT : 0;
    }
    r->top = j;
    bn_check_top(r);
    return (1);
}